

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnGetTrain(XL *out,string *train_path)

{
  std::__cxx11::string::_M_assign((string *)train_path);
  return 0;
}

Assistant:

XL_DLL int XLearnGetTrain(XL *out, std::string& train_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  train_path = xl->GetHyperParam().train_set_file;
  API_END();
}